

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmTargetTraceDependencies::cmTargetTraceDependencies
          (cmTargetTraceDependencies *this,cmGeneratorTarget *target)

{
  iterator *piVar1;
  _Rb_tree_header *p_Var2;
  cmMakefile *this_00;
  cmLocalGenerator *pcVar3;
  cmGeneratorTarget *pcVar4;
  cmGeneratorTarget *pcVar5;
  _Elt_pointer ppcVar6;
  bool bVar7;
  bool bVar8;
  _Base_ptr p_Var9;
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *__x;
  string *psVar10;
  ostream *poVar11;
  pointer config;
  _Base_ptr p_Var12;
  cmCustomCommand *pcVar13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  pointer ppcVar16;
  cmTarget *pcVar17;
  pair<std::_Rb_tree_iterator<cmSourceFile_*>,_bool> pVar18;
  cmSourceFile *sf;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> emitted;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  tgts;
  ostringstream e;
  cmSourceFile *local_2a0;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  deque<cmSourceFile*,std::allocator<cmSourceFile*>> *local_258;
  string *local_250;
  string local_248;
  _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
  local_228;
  string local_1f8;
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  local_1d8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  this->GeneratorTarget = target;
  local_258 = (deque<cmSourceFile*,std::allocator<cmSourceFile*>> *)&this->SourceQueue;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::_M_initialize_map
            ((_Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_258,0);
  p_Var2 = &(this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header;
  (this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->NameMap)._M_t._M_impl.super__Rb_tree_header;
  (this->NameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->NameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->NameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->NameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->NameMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->NewSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->NewSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->NewSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar17 = target->Target;
  this_00 = pcVar17->Makefile;
  this->Makefile = this_00;
  pcVar3 = target->LocalGenerator;
  this->LocalGenerator = pcVar3;
  this->GlobalGenerator = pcVar3->GlobalGenerator;
  this->CurrentEntry = (SourceEntry *)0x0;
  if (pcVar17->TargetTypeValue != INTERFACE_LIBRARY) {
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmMakefile::GetConfigurations(&local_1f8,this_00,&local_278,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if (local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_278,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
    local_228._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_228._M_impl.super__Rb_tree_header._M_header;
    local_228._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_228._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_228._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_228._M_impl.super__Rb_tree_header._M_header._M_right =
         local_228._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
      ::~_Rb_tree(&local_228);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_278);
    }
    else {
      p_Var2 = &local_1d8._M_impl.super__Rb_tree_header;
      config = local_278.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_250 = config;
        cmGeneratorTarget::GetSourceFiles(this->GeneratorTarget,&local_298,config);
        ppcVar16 = local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        if (local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          bVar8 = false;
          bVar7 = true;
        }
        else {
          do {
            local_2a0 = *ppcVar16;
            __x = &cmGlobalGenerator::GetFilenameTargetDepends(this->GlobalGenerator,local_2a0)->
                   _M_t;
            std::
            _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
            ::_Rb_tree(&local_1d8,__x);
            if (local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
              pcVar4 = this->GeneratorTarget;
              p_Var9 = local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var15 = &p_Var2->_M_header;
              do {
                p_Var14 = p_Var15;
                p_Var12 = p_Var9;
                pcVar5 = *(cmGeneratorTarget **)(p_Var12 + 1);
                p_Var15 = p_Var12;
                if (pcVar5 < pcVar4) {
                  p_Var15 = p_Var14;
                }
                p_Var9 = (&p_Var12->_M_left)[pcVar5 < pcVar4];
              } while ((&p_Var12->_M_left)[pcVar5 < pcVar4] != (_Base_ptr)0x0);
              if ((_Rb_tree_header *)p_Var15 != p_Var2) {
                if (pcVar5 < pcVar4) {
                  p_Var12 = p_Var14;
                }
                if (*(cmGeneratorTarget **)(p_Var12 + 1) <= pcVar4) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"Evaluation output file\n  \"",0x1a);
                  psVar10 = cmSourceFile::GetFullPath(local_2a0,(string *)0x0);
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1a8,(psVar10->_M_dataplus)._M_p,
                                       psVar10->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,
                             "\"\ndepends on the sources of a target it is used in.  This is a dependency loop and is not allowed."
                             ,0x62);
                  pcVar3 = this->GeneratorTarget->LocalGenerator;
                  std::__cxx11::stringbuf::str();
                  cmLocalGenerator::IssueMessage(pcVar3,FATAL_ERROR,&local_248);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_248._M_dataplus._M_p != &local_248.field_2) {
                    operator_delete(local_248._M_dataplus._M_p,
                                    local_248.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  std::ios_base::~ios_base(local_138);
                  std::
                  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  ::~_Rb_tree(&local_1d8);
                  bVar8 = true;
                  bVar7 = false;
                  goto LAB_0037b988;
                }
              }
            }
            pVar18 = std::
                     _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                     ::_M_insert_unique<cmSourceFile*const&>
                               ((_Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                                 *)&local_228,&local_2a0);
            if ((((undefined1  [16])pVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
               (pVar18 = std::
                         _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                         ::_M_insert_unique<cmSourceFile*const&>
                                   ((_Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                                     *)&this->SourcesQueued,&local_2a0),
               ((undefined1  [16])pVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
              ppcVar6 = (this->SourceQueue).c.
                        super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_cur;
              if (ppcVar6 ==
                  (this->SourceQueue).c.
                  super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<cmSourceFile*,std::allocator<cmSourceFile*>>::
                _M_push_back_aux<cmSourceFile*const&>(local_258,&local_2a0);
              }
              else {
                *ppcVar6 = local_2a0;
                piVar1 = &(this->SourceQueue).c.
                          super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                          .super__Deque_impl_data._M_finish;
                piVar1->_M_cur = piVar1->_M_cur + 1;
              }
            }
            std::
            _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
            ::~_Rb_tree(&local_1d8);
            ppcVar16 = ppcVar16 + 1;
          } while (ppcVar16 !=
                   local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
          bVar8 = false;
          bVar7 = true;
        }
LAB_0037b988:
        if (local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_298.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_298.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_298.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (!bVar7) goto LAB_0037b9be;
        config = local_250 + 1;
      } while (config != local_278.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      bVar8 = false;
LAB_0037b9be:
      std::
      _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
      ::~_Rb_tree(&local_228);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_278);
      if (bVar8) {
        return;
      }
    }
  }
  pcVar17 = this->GeneratorTarget->Target;
  pcVar13 = (pcVar17->PreBuildCommands).
            super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pcVar13 !=
      (pcVar17->PreBuildCommands).
      super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      CheckCustomCommand(this,pcVar13);
      pcVar13 = pcVar13 + 1;
    } while (pcVar13 !=
             (pcVar17->PreBuildCommands).
             super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
             super__Vector_impl_data._M_finish);
    pcVar17 = this->GeneratorTarget->Target;
  }
  pcVar13 = (pcVar17->PreLinkCommands).
            super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pcVar13 !=
      (pcVar17->PreLinkCommands).
      super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      CheckCustomCommand(this,pcVar13);
      pcVar13 = pcVar13 + 1;
    } while (pcVar13 !=
             (pcVar17->PreLinkCommands).
             super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
             super__Vector_impl_data._M_finish);
    pcVar17 = this->GeneratorTarget->Target;
  }
  for (pcVar13 = (pcVar17->PostBuildCommands).
                 super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pcVar13 !=
      (pcVar17->PostBuildCommands).
      super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
      super__Vector_impl_data._M_finish; pcVar13 = pcVar13 + 1) {
    CheckCustomCommand(this,pcVar13);
  }
  return;
}

Assistant:

cmTargetTraceDependencies
::cmTargetTraceDependencies(cmGeneratorTarget* target):
  GeneratorTarget(target)
{
  // Convenience.
  this->Makefile = target->Target->GetMakefile();
  this->LocalGenerator = target->GetLocalGenerator();
  this->GlobalGenerator = this->LocalGenerator->GetGlobalGenerator();
  this->CurrentEntry = 0;

  // Queue all the source files already specified for the target.
  if (target->GetType() != cmState::INTERFACE_LIBRARY)
    {
    std::vector<std::string> configs;
    this->Makefile->GetConfigurations(configs);
    if (configs.empty())
      {
      configs.push_back("");
      }
    std::set<cmSourceFile*> emitted;
    for(std::vector<std::string>::const_iterator ci = configs.begin();
        ci != configs.end(); ++ci)
      {
      std::vector<cmSourceFile*> sources;
      this->GeneratorTarget->GetSourceFiles(sources, *ci);
      for(std::vector<cmSourceFile*>::const_iterator si = sources.begin();
          si != sources.end(); ++si)
        {
        cmSourceFile* sf = *si;
        const std::set<cmGeneratorTarget const*> tgts =
                          this->GlobalGenerator->GetFilenameTargetDepends(sf);
        if (tgts.find(this->GeneratorTarget) != tgts.end())
          {
          std::ostringstream e;
          e << "Evaluation output file\n  \"" << sf->GetFullPath()
            << "\"\ndepends on the sources of a target it is used in.  This "
              "is a dependency loop and is not allowed.";
          this->GeneratorTarget
              ->LocalGenerator->IssueMessage(cmake::FATAL_ERROR, e.str());
          return;
          }
        if(emitted.insert(sf).second && this->SourcesQueued.insert(sf).second)
          {
          this->SourceQueue.push(sf);
          }
        }
      }
    }

  // Queue pre-build, pre-link, and post-build rule dependencies.
  this->CheckCustomCommands(
        this->GeneratorTarget->GetPreBuildCommands());
  this->CheckCustomCommands(
        this->GeneratorTarget->GetPreLinkCommands());
  this->CheckCustomCommands(
        this->GeneratorTarget->GetPostBuildCommands());
}